

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

Curl_dns_entry *
dnscache_add_addr(Curl_easy *data,Curl_dnscache *dnscache,Curl_addrinfo *addr,char *hostname,
                 size_t hostlen,int port,_Bool permanent)

{
  curl_trc_feat *pcVar1;
  undefined8 uVar2;
  ulong uVar3;
  CURLcode CVar4;
  undefined8 *puVar5;
  uchar *rnd;
  size_t sVar6;
  time_t tVar7;
  long lVar8;
  Curl_dns_entry *pCVar9;
  Curl_addrinfo *pCVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  size_t num;
  char entry_id [262];
  char local_138 [264];
  
  uVar11 = *(ulong *)&(data->set).field_0x894;
  sVar6 = hostlen;
  if ((uVar11 >> 0x2e & 1) != 0) {
    if (addr == (Curl_addrinfo *)0x0) {
      addr = (Curl_addrinfo *)0x0;
    }
    else {
      pCVar10 = addr;
      uVar13 = 0;
      do {
        uVar12 = uVar13;
        pCVar10 = pCVar10->ai_next;
        uVar13 = uVar12 + 1;
      } while (pCVar10 != (Curl_addrinfo *)0x0);
      if ((int)uVar12 != 0) {
        if ((((uint)uVar11 >> 0x1e & 1) != 0 && data != (Curl_easy *)0x0) &&
           ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))
           )) {
          Curl_infof(data,"Shuffling %i addresses",uVar13 & 0xffffffff);
        }
        puVar5 = (undefined8 *)(*Curl_cmalloc)((uVar13 & 0xffffffff) * 8);
        if (puVar5 == (undefined8 *)0x0) goto LAB_00131ca6;
        *puVar5 = addr;
        uVar11 = 1;
        do {
          puVar5[uVar11] = *(undefined8 *)(puVar5[uVar11 - 1] + 0x28);
          uVar11 = uVar11 + 1;
        } while ((uVar13 & 0xffffffff) != uVar11);
        num = (uVar13 & 0xffffffff) << 2;
        rnd = (uchar *)(*Curl_cmalloc)(num);
        if (rnd == (uchar *)0x0) {
          (*Curl_cfree)(puVar5);
          goto LAB_00131ca6;
        }
        CVar4 = Curl_rand_bytes(data,rnd,num);
        uVar11 = uVar13;
        if (CVar4 == CURLE_OK) {
          do {
            uVar3 = (ulong)*(uint *)(rnd + uVar11 * 4 + -4) % (uVar11 & 0xffffffff);
            uVar2 = puVar5[uVar3];
            puVar5[uVar3] = puVar5[uVar11 - 1];
            puVar5[uVar11 - 1] = uVar2;
            uVar11 = uVar11 - 1;
          } while (1 < (long)uVar11);
          uVar11 = 1;
          do {
            *(undefined8 *)(puVar5[uVar11 - 1] + 0x28) = puVar5[uVar11];
            uVar11 = uVar11 + 1;
          } while ((uVar13 & 0xffffffff) != uVar11);
          *(undefined8 *)(puVar5[uVar12 & 0xffffffff] + 0x28) = 0;
          addr = (Curl_addrinfo *)*puVar5;
        }
        (*Curl_cfree)(rnd);
        (*Curl_cfree)(puVar5);
      }
    }
  }
  if (hostlen == 0) {
    hostlen = strlen(hostname);
  }
  puVar5 = (undefined8 *)(*Curl_ccalloc)(1,hostlen + 0x20);
  if (puVar5 != (undefined8 *)0x0) {
    sVar6 = create_dnscache_id(hostname,hostlen,port,local_138,sVar6);
    puVar5[2] = 1;
    *puVar5 = addr;
    if (permanent) {
      lVar8 = 0;
    }
    else {
      tVar7 = time((time_t *)0x0);
      lVar8 = tVar7 + (ulong)(tVar7 == 0);
    }
    puVar5[1] = lVar8;
    *(int *)(puVar5 + 3) = port;
    if (hostlen != 0) {
      memcpy((void *)((long)puVar5 + 0x1c),hostname,hostlen);
    }
    pCVar9 = (Curl_dns_entry *)Curl_hash_add(&dnscache->entries,local_138,sVar6 + 1,puVar5);
    if (pCVar9 == (Curl_dns_entry *)0x0) {
      Curl_freeaddrinfo((Curl_addrinfo *)*puVar5);
      (*Curl_cfree)(puVar5);
      return (Curl_dns_entry *)0x0;
    }
    pCVar9->refcount = pCVar9->refcount + 1;
    return pCVar9;
  }
LAB_00131ca6:
  Curl_freeaddrinfo(addr);
  return (Curl_dns_entry *)0x0;
}

Assistant:

static struct Curl_dns_entry *
dnscache_add_addr(struct Curl_easy *data,
                  struct Curl_dnscache *dnscache,
                  struct Curl_addrinfo *addr,
                  const char *hostname,
                  size_t hostlen, /* length or zero */
                  int port,
                  bool permanent)
{
  char entry_id[MAX_HOSTCACHE_LEN];
  size_t entry_len;
  struct Curl_dns_entry *dns;
  struct Curl_dns_entry *dns2;

#ifndef CURL_DISABLE_SHUFFLE_DNS
  /* shuffle addresses if requested */
  if(data->set.dns_shuffle_addresses) {
    CURLcode result = Curl_shuffle_addr(data, &addr);
    if(result) {
      Curl_freeaddrinfo(addr);
      return NULL;
    }
  }
#endif
  if(!hostlen)
    hostlen = strlen(hostname);

  /* Create a new cache entry */
  dns = calloc(1, sizeof(struct Curl_dns_entry) + hostlen);
  if(!dns) {
    Curl_freeaddrinfo(addr);
    return NULL;
  }

  /* Create an entry id, based upon the hostname and port */
  entry_len = create_dnscache_id(hostname, hostlen, port,
                                 entry_id, sizeof(entry_id));

  dns->refcount = 1; /* the cache has the first reference */
  dns->addr = addr; /* this is the address(es) */
  if(permanent)
    dns->timestamp = 0; /* an entry that never goes stale */
  else {
    dns->timestamp = time(NULL);
    if(dns->timestamp == 0)
      dns->timestamp = 1;
  }
  dns->hostport = port;
  if(hostlen)
    memcpy(dns->hostname, hostname, hostlen);

  /* Store the resolved data in our DNS cache. */
  dns2 = Curl_hash_add(&dnscache->entries, entry_id, entry_len + 1,
                       (void *)dns);
  if(!dns2) {
    dnscache_entry_free(dns);
    return NULL;
  }

  dns = dns2;
  dns->refcount++;         /* mark entry as in-use */
  return dns;
}